

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shared_alloc.hpp
# Opt level: O1

LO __thiscall Omega_h::HostWrite<int>::size(HostWrite<int> *this)

{
  Alloc *pAVar1;
  ulong uVar2;
  
  pAVar1 = (this->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  return (LO)(uVar2 >> 2);
}

Assistant:

const noexcept {
#ifndef __CUDA_ARCH__
    if (!(reinterpret_cast<std::uintptr_t>(alloc) & IN_PARALLEL)) {
#if defined(__GNUC__) && (__GNUC__ >= 7) && (!defined(__clang__))
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wnull-dereference"
#endif
      return alloc->size;
#if defined(__GNUC__) && (__GNUC__ >= 7) && (!defined(__clang__))
#pragma GCC diagnostic pop
#endif
    }
#endif
    return reinterpret_cast<std::uintptr_t>(alloc) >> 3;
  }